

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  u8 uVar1;
  sqlite3 *psVar2;
  Op *pOVar3;
  int iVar4;
  Parse *pPVar5;
  TriggerPrg *pTVar6;
  SubProgram *pSVar7;
  Vdbe *pVVar8;
  char *pcVar9;
  Expr *pEVar10;
  SrcList *pSVar11;
  IdList *pColumn;
  Upsert *pUpsert;
  Select *pSVar12;
  ExprList *pEVar13;
  Expr *in_R8;
  TriggerStep *pStep;
  NameContext sNC;
  undefined4 in_stack_fffffffffffffd78;
  Upsert *pUpsert_00;
  NameContext local_238;
  SelectDest local_1f8;
  Parse local_1d0;
  
  pPVar5 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar5 = pParse;
  }
  for (pTVar6 = pPVar5->pTriggerPrg; pTVar6 != (TriggerPrg *)0x0; pTVar6 = pTVar6->pNext) {
    if ((pTVar6->pTrigger == pTrigger) && (pTVar6->orconf == orconf)) {
      return pTVar6;
    }
  }
  psVar2 = pParse->db;
  pTVar6 = (TriggerPrg *)sqlite3DbMallocZero(psVar2,0x28);
  if (pTVar6 != (TriggerPrg *)0x0) {
    pTVar6->pNext = pPVar5->pTriggerPrg;
    pPVar5->pTriggerPrg = pTVar6;
    pSVar7 = (SubProgram *)sqlite3DbMallocZero(psVar2,0x30);
    pTVar6->pProgram = pSVar7;
    if (pSVar7 != (SubProgram *)0x0) {
      pVVar8 = pPVar5->pVdbe;
      pSVar7->pNext = pVVar8->pProgram;
      pVVar8->pProgram = pSVar7;
      pTVar6->pTrigger = pTrigger;
      pTVar6->orconf = orconf;
      pTVar6->aColmask[0] = 0xffffffff;
      pTVar6->aColmask[1] = 0xffffffff;
      memset(&local_1d0.zErrMsg,0,0xd8);
      memset(&local_1d0.sLastToken,0,0x88);
      local_1d0.pOuterParse = psVar2->pParse;
      local_238.pParse = &local_1d0;
      psVar2->pParse = local_238.pParse;
      local_1d0.db = psVar2;
      if (psVar2->mallocFailed != '\0') {
        sqlite3ErrorMsg(&local_1d0,"out of memory");
      }
      local_238.pSrcList = (SrcList *)0x0;
      local_238.nRef = 0;
      local_238.nNcErr = 0;
      local_238.ncFlags = 0;
      local_238._44_4_ = 0;
      local_238.uNC.pEList = (ExprList *)0x0;
      local_238.pNext = (NameContext *)0x0;
      local_238.pWinSelect = (Select *)0x0;
      local_1d0.zAuthContext = pTrigger->zName;
      local_1d0.eTriggerOp = pTrigger->op;
      local_1d0.nQueryLoop = pParse->nQueryLoop;
      local_1d0.prepFlags = pParse->prepFlags;
      local_1d0.pToplevel = pPVar5;
      local_1d0.pTriggerTab = pTab;
      pVVar8 = sqlite3GetVdbe(local_238.pParse);
      if (pVVar8 == (Vdbe *)0x0) {
        if (pParse->nErr == 0) {
          pParse->zErrMsg = local_1d0.zErrMsg;
          pParse->nErr = local_1d0.nErr;
          pParse->rc = local_1d0.rc;
        }
        else if (local_1d0.zErrMsg != (char *)0x0) {
          sqlite3DbFreeNN(local_1d0.db,local_1d0.zErrMsg);
        }
      }
      else {
        if (pTrigger->zName != (char *)0x0) {
          pcVar9 = sqlite3MPrintf(psVar2,"-- TRIGGER %s");
          sqlite3VdbeChangeP4(pVVar8,-1,pcVar9,-6);
        }
        if (pTrigger->pWhen == (Expr *)0x0) {
          pUpsert_00 = (Upsert *)0x0;
        }
        else {
          pUpsert_00 = (Upsert *)0x0;
          pEVar10 = exprDup(psVar2,pTrigger->pWhen,0,(u8 **)0x0);
          if ((psVar2->mallocFailed == '\0') &&
             (iVar4 = sqlite3ResolveExprNames(&local_238,pEVar10), iVar4 == 0)) {
            local_1d0.nLabel = local_1d0.nLabel - 1;
            pUpsert_00 = (Upsert *)(ulong)(uint)local_1d0.nLabel;
            sqlite3ExprIfFalse(&local_1d0,pEVar10,local_1d0.nLabel,0x10);
          }
          if (pEVar10 != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar2,pEVar10);
          }
        }
        psVar2 = local_1d0.db;
        pStep = pTrigger->step_list;
        if (pStep != (TriggerStep *)0x0) {
          do {
            pEVar13 = (ExprList *)(ulong)(uint)orconf;
            local_1d0.eOrconf = (u8)orconf;
            if (orconf == 0xb) {
              local_1d0.eOrconf = pStep->orconf;
            }
            if (pStep->zSpan != (char *)0x0) {
              pcVar9 = sqlite3MPrintf(psVar2,"-- %s");
              in_R8 = (Expr *)0x0;
              iVar4 = sqlite3VdbeAddOp3(local_1d0.pVdbe,0xb5,0x7fffffff,1,0);
              pEVar13 = (ExprList *)0xfffffffa;
              sqlite3VdbeChangeP4(local_1d0.pVdbe,iVar4,pcVar9,-6);
            }
            uVar1 = pStep->op;
            if (uVar1 == '\x7f') {
              pSVar11 = sqlite3TriggerStepSrc(&local_1d0,pStep);
              pSVar12 = sqlite3SelectDup(psVar2,pStep->pSelect,0);
              pColumn = sqlite3IdListDup(psVar2,pStep->pIdList);
              uVar1 = local_1d0.eOrconf;
              pUpsert = sqlite3UpsertDup(psVar2,pStep->pUpsert);
              sqlite3Insert(&local_1d0,pSVar11,pSVar12,pColumn,(uint)uVar1,pUpsert);
LAB_001ae3a5:
              in_R8 = (Expr *)0x0;
              sqlite3VdbeAddOp3(local_1d0.pVdbe,0x83,0,0,0);
            }
            else {
              if (uVar1 == 0x80) {
                pSVar11 = sqlite3TriggerStepSrc(&local_1d0,pStep);
                if (pStep->pWhere == (Expr *)0x0) {
                  pEVar10 = (Expr *)0x0;
                }
                else {
                  pEVar13 = (ExprList *)0x0;
                  pEVar10 = exprDup(psVar2,pStep->pWhere,0,(u8 **)0x0);
                }
                sqlite3DeleteFrom(&local_1d0,pSVar11,pEVar10,pEVar13,in_R8);
                goto LAB_001ae3a5;
              }
              if (uVar1 == 0x81) {
                pSVar11 = sqlite3TriggerStepSrc(&local_1d0,pStep);
                pEVar13 = sqlite3ExprListDup(psVar2,pStep->pExprList,0);
                if (pStep->pWhere == (Expr *)0x0) {
                  pEVar10 = (Expr *)0x0;
                }
                else {
                  pEVar10 = exprDup(psVar2,pStep->pWhere,0,(u8 **)0x0);
                }
                sqlite3Update(&local_1d0,pSVar11,pEVar13,pEVar10,(uint)local_1d0.eOrconf,
                              (ExprList *)0x0,(Expr *)CONCAT44(orconf,in_stack_fffffffffffffd78),
                              pUpsert_00);
                goto LAB_001ae3a5;
              }
              pSVar12 = sqlite3SelectDup(psVar2,pStep->pSelect,0);
              local_1f8.eDest = '\x04';
              local_1f8.zAffSdst = (char *)0x0;
              local_1f8.iSDParm = 0;
              local_1f8.iSDParm2 = 0;
              local_1f8.iSdst = 0;
              local_1f8.nSdst = 0;
              sqlite3Select(&local_1d0,pSVar12,&local_1f8);
              if (pSVar12 != (Select *)0x0) {
                clearSelect(psVar2,pSVar12,1);
              }
            }
            pStep = pStep->pNext;
          } while (pStep != (TriggerStep *)0x0);
        }
        if ((int)pUpsert_00 != 0) {
          sqlite3VdbeResolveLabel(pVVar8,(int)pUpsert_00);
        }
        sqlite3VdbeAddOp3(pVVar8,0x46,0,0,0);
        if (pParse->nErr == 0) {
          pParse->zErrMsg = local_1d0.zErrMsg;
          pParse->nErr = local_1d0.nErr;
          pParse->rc = local_1d0.rc;
        }
        else if (local_1d0.zErrMsg != (char *)0x0) {
          sqlite3DbFreeNN(local_1d0.db,local_1d0.zErrMsg);
        }
        if (pParse->nErr == 0) {
          pOVar3 = pVVar8->aOp;
          resolveP2Values(pVVar8,&pPVar5->nMaxArg);
          pSVar7->nOp = pVVar8->nOp;
          pVVar8->aOp = (Op *)0x0;
          pSVar7->aOp = pOVar3;
        }
        pSVar7->nMem = local_1d0.nMem;
        pSVar7->nCsr = local_1d0.nTab;
        pSVar7->token = pTrigger;
        pTVar6->aColmask[0] = local_1d0.oldmask;
        pTVar6->aColmask[1] = local_1d0.newmask;
        sqlite3VdbeDelete(pVVar8);
      }
      sqlite3ParseObjectReset(&local_1d0);
      goto LAB_001ae4be;
    }
  }
  pTVar6 = (TriggerPrg *)0x0;
LAB_001ae4be:
  pParse->db->errByteOffset = -1;
  return pTVar6;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg;
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf);
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
    pParse->db->errByteOffset = -1;
  }

  return pPrg;
}